

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_epoll.h
# Opt level: O2

int sp_add(int efd,int sock,void *ud)

{
  int iVar1;
  epoll_event ev;
  
  ev.events = 1;
  ev.data.ptr = ud;
  iVar1 = epoll_ctl(efd,1,sock,(epoll_event *)&ev);
  return (int)(iVar1 == -1);
}

Assistant:

static int 
sp_add(int efd, int sock, void *ud) {
	struct epoll_event ev;
	ev.events = EPOLLIN;
	ev.data.ptr = ud;
	if (epoll_ctl(efd, EPOLL_CTL_ADD, sock, &ev) == -1) {
		return 1;
	}
	return 0;
}